

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TextureCubeMapArraySamplingTest::iterate(TextureCubeMapArraySamplingTest *this)

{
  shadersVectorType *this_00;
  TestLog *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  MessageBuilder *pMVar4;
  NotSupportedError *this_01;
  size_t in_RCX;
  void *__buf;
  char *description;
  TestContext *this_02;
  bool bVar5;
  allocator<char> local_1e2;
  allocator<char> local_1e1;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  long lVar3;
  
  if ((this->super_TestCaseBase).m_is_texture_cube_map_array_supported != false) {
    local_1a0 = (undefined1  [8])0x0;
    this_00 = &this->m_shaders;
    local_198 = (_func_int **)0x16fe765;
    std::
    vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
    ::emplace_back<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>
              (this_00,(shaderConfiguration *)local_1a0);
    local_1a0 = (undefined1  [8])&DAT_00000001;
    local_198 = (_func_int **)0x17c623a;
    std::
    vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
    ::emplace_back<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>
              (this_00,(shaderConfiguration *)local_1a0);
    local_1a0 = (undefined1  [8])0x5;
    local_198 = (_func_int **)0x191281f;
    std::
    vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
    ::emplace_back<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>
              (this_00,(shaderConfiguration *)local_1a0);
    if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == true) {
      local_1a0 = (undefined1  [8])0x2;
      local_198 = (_func_int **)0x1875d11;
      std::
      vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
      ::emplace_back<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>
                (this_00,(shaderConfiguration *)local_1a0);
    }
    if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
      local_1a0._4_4_ = (this->super_TestCaseBase).m_glExtTokens.PATCHES;
      local_1a0._0_4_ = Tesselation_Control;
      local_198 = (_func_int **)0x17c6243;
      std::
      vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
      ::emplace_back<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>
                (this_00,(shaderConfiguration *)local_1a0);
      local_1a0._4_4_ = (this->super_TestCaseBase).m_glExtTokens.PATCHES;
      local_1a0._0_4_ = 4;
      local_198 = (_func_int **)0x17c6257;
      std::
      vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
      ::emplace_back<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>
                (this_00,(shaderConfiguration *)local_1a0);
    }
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar3 + 0x6d0))(1,&this->m_framebuffer_object_id);
    if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
      (**(code **)(lVar3 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
    }
    (**(code **)(lVar3 + 0xff0))(0xd05,1);
    (**(code **)(lVar3 + 0xff0))(0xcf5,1);
    testFormats(this,&this->m_formats,&this->m_resolutions);
    testFormats(this,&this->m_compressed_formats,&this->m_compressed_resolutions);
    if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
      (**(code **)(lVar3 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
    }
    (**(code **)(lVar3 + 0xff0))(0xd05,4);
    (**(code **)(lVar3 + 0xff0))(0xcf5,4);
    (**(code **)(lVar3 + 0x440))(1,&this->m_framebuffer_object_id);
    this->m_framebuffer_object_id = 0;
    pTVar1 = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"Summary",&local_1e1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,fixed_sample_locations_values + 1,&local_1e2);
    tcu::LogSection::LogSection((LogSection *)local_1a0,&local_1c0,&local_1e0);
    tcu::LogSection::write((LogSection *)local_1a0,(int)pTVar1,__buf,in_RCX);
    tcu::LogSection::~LogSection((LogSection *)local_1a0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1c0);
    bVar5 = this->invalid_type_cases != 0 || this->failed_cases != 0;
    if (bVar5) {
      local_1a0 = (undefined1  [8])
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      std::operator<<((ostream *)&local_198,"Test failed! Number of found errors: ");
      pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a0,&this->failed_cases);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
      local_1a0 = (undefined1  [8])
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      std::operator<<((ostream *)&local_198,"Invalid shaders: ");
      pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a0,&this->invalid_shaders);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
      local_1a0 = (undefined1  [8])
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      std::operator<<((ostream *)&local_198,"Invalid programs: ");
      pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a0,&this->invalid_programs);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
      local_1a0 = (undefined1  [8])
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      std::operator<<((ostream *)&local_198,
                      "glGetActiveUniform or glGetProgramResourceiv reported invalid type: ");
      pMVar4 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1a0,&this->invalid_type_cases);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
      this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Fail";
    }
    else {
      this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
    }
    tcu::TestContext::setTestResult(this_02,(uint)bVar5,description);
    local_1a0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    std::operator<<((ostream *)&local_198,"Number of executed test cases: ");
    pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a0,&this->tested_cases);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    local_1a0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    std::operator<<((ostream *)&local_198,"Total shaders: ");
    pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a0,&this->compiled_shaders);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    local_1a0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    std::operator<<((ostream *)&local_198,"Total programs: ");
    pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a0,&this->linked_programs);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    tcu::TestLog::endSection
              (((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Texture cube map array functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
             ,0xc59);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult TextureCubeMapArraySamplingTest::iterate()
{
#if TEXTURECUBEMAPARRAYSAMPLINGTEST_DUMP_TEXTURES_FOR_COMPRESSION

	for (resolutionsVectorType::iterator resolution		= m_compressed_resolutions.begin(),
										 end_resolution = m_compressed_resolutions.end();
		 end_resolution != resolution; ++resolution)
	{
		prepareDumpForTextureCompression(*resolution);
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;

#else  /* TEXTURECUBEMAPARRAYSAMPLINGTEST_DUMP_TEXTURES_FOR_COMPRESSION */

	if (false == m_is_texture_cube_map_array_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_CUBE_MAP_ARRAY_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	// These shader stages are always supported
	m_shaders.push_back(shaderConfiguration(Compute, GL_POINTS, "Compute"));
	m_shaders.push_back(shaderConfiguration(Fragment, GL_POINTS, "Fragment"));
	m_shaders.push_back(shaderConfiguration(Vertex, GL_POINTS, "Vertex"));

	// Check if geometry shader is supported
	if (true == m_is_geometry_shader_extension_supported)
	{
		m_shaders.push_back(shaderConfiguration(Geometry, GL_POINTS, "Geometry"));
	}

	// Check if tesselation shaders are supported
	if (true == m_is_tessellation_shader_supported)
	{
		m_shaders.push_back(shaderConfiguration(Tesselation_Control, m_glExtTokens.PATCHES, "Tesselation_Control"));
		m_shaders.push_back(
			shaderConfiguration(Tesselation_Evaluation, m_glExtTokens.PATCHES, "Tesselation_Evaluation"));
	}

	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genFramebuffers(1, &m_framebuffer_object_id);

	if (true == m_is_tessellation_shader_supported)
	{
		gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	}

	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

	testFormats(m_formats, m_resolutions);
	testFormats(m_compressed_formats, m_compressed_resolutions);

	if (true == m_is_tessellation_shader_supported)
	{
		gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);
	}

	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 4);

	gl.deleteFramebuffers(1, &m_framebuffer_object_id);
	m_framebuffer_object_id = 0;

	m_testCtx.getLog() << tcu::TestLog::Section("Summary", "");
	if ((0 != failed_cases) || (0 != invalid_type_cases))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Test failed! Number of found errors: " << failed_cases
						   << tcu::TestLog::EndMessage;

		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid shaders: " << invalid_shaders
						   << tcu::TestLog::EndMessage;

		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid programs: " << invalid_programs
						   << tcu::TestLog::EndMessage;

		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetActiveUniform or glGetProgramResourceiv reported invalid type: "
						   << invalid_type_cases << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Number of executed test cases: " << tested_cases
					   << tcu::TestLog::EndMessage;

	m_testCtx.getLog() << tcu::TestLog::Message << "Total shaders: " << compiled_shaders << tcu::TestLog::EndMessage;

	m_testCtx.getLog() << tcu::TestLog::Message << "Total programs: " << linked_programs << tcu::TestLog::EndMessage;

	m_testCtx.getLog() << tcu::TestLog::EndSection;

	return STOP;
#endif /* TEXTURECUBEMAPARRAYSAMPLINGTEST_DUMP_TEXTURES_FOR_COMPRESSION */
}